

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_NodeAssignRandom(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  Ivy_Obj_t *pIVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  if ((*(uint *)&pObj->field_0x8 & 0xf) == 1) {
    if (0 < p->nSimWords) {
      pIVar1 = pObj->pFanout;
      lVar5 = 0;
      do {
        iVar2 = rand();
        iVar3 = rand();
        uVar4 = rand();
        *(uint *)((long)&pIVar1->pFanout + lVar5 * 4) = uVar4 ^ iVar3 << 0xc ^ iVar2 << 0x18;
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nSimWords);
    }
    return;
  }
  __assert_fail("Ivy_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x2ac,"void Ivy_NodeAssignRandom(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_NodeAssignRandom( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims;
    int i;
    assert( Ivy_ObjIsPi(pObj) );
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        pSims->pData[i] = Ivy_ObjRandomSim();
}